

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O3

void MPIX_step_send(comm_pkg *comm,void *send_data,int tag,MPI_Comm mpi_comm,MPI_Datatype mpi_type,
                   MPI_Request *send_requests,char **send_buffer_ptr)

{
  int iVar1;
  void *pvVar2;
  MPI_Datatype poVar3;
  char *pcVar4;
  comm_data *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int type_size;
  int size;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  char *local_58;
  void *local_50;
  MPI_Datatype local_48;
  MPI_Request *local_40;
  long local_38;
  
  local_50 = send_data;
  local_40 = send_requests;
  MPI_Type_size(mpi_type,&local_60);
  pcVar5 = comm->send_data;
  local_48 = mpi_type;
  if (pcVar5->size_msgs == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    MPI_Pack_size(pcVar5->size_msgs,mpi_type,mpi_comm,&local_5c);
    iVar6 = -1;
    if (-1 < local_5c) {
      iVar6 = local_5c;
    }
    pcVar4 = (char *)operator_new__((long)iVar6);
    pcVar5 = comm->send_data;
  }
  local_70 = 0;
  if (0 < pcVar5->num_msgs) {
    lVar10 = 0;
    local_6c = tag;
    local_58 = pcVar4;
    do {
      poVar3 = local_48;
      pvVar2 = local_50;
      iVar6 = pcVar5->indptr[lVar10];
      lVar8 = (long)iVar6;
      iVar9 = pcVar5->indptr[lVar10 + 1];
      iVar7 = local_70;
      iVar1 = pcVar5->procs[lVar10];
      local_38 = lVar10;
      if (iVar6 < iVar9) {
        iVar9 = iVar9 - iVar6;
        local_68 = pcVar5->procs[lVar10];
        local_64 = local_70;
        do {
          MPI_Pack((void *)((long)local_60 * (long)comm->send_data->indices[lVar8] + (long)pvVar2),1
                   ,poVar3,local_58,local_5c,&local_70,mpi_comm);
          lVar8 = lVar8 + 1;
          iVar9 = iVar9 + -1;
          pcVar4 = local_58;
          tag = local_6c;
          iVar7 = local_64;
          iVar1 = local_68;
        } while (iVar9 != 0);
      }
      lVar10 = local_38 + 1;
      MPI_Isend(pcVar4 + iVar7,local_70 - iVar7,&ompi_mpi_packed,iVar1,tag,mpi_comm,
                local_40 + local_38);
      pcVar5 = comm->send_data;
    } while (lVar10 < pcVar5->num_msgs);
  }
  if (pcVar4 != (char *)0x0) {
    *send_buffer_ptr = pcVar4;
  }
  return;
}

Assistant:

static void MPIX_step_send(comm_pkg* comm, void* send_data,
        int tag, MPI_Comm mpi_comm, MPI_Datatype mpi_type,
        MPI_Request* send_requests, char** send_buffer_ptr)
{
    int idx, proc, start, end;
    int size, type_size, addr;
    char* send_buffer = NULL;
    char* data = reinterpret_cast<char*>(send_data);
    MPI_Type_size(mpi_type, &type_size);
    if (comm->send_data->size_msgs)
    {
        MPI_Pack_size(comm->send_data->size_msgs, mpi_type, mpi_comm, &size);
        send_buffer = new char[size];
    }

    int ctr = 0;
    int prev_ctr = 0;
    for (int i = 0; i < comm->send_data->num_msgs; i++)
    {
        proc = comm->send_data->procs[i];
        start = comm->send_data->indptr[i];
        end = comm->send_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = comm->send_data->indices[j];
            MPI_Pack(&(data[idx*type_size]), 1, mpi_type, 
                    send_buffer, size, &ctr, mpi_comm);
        }
        MPI_Isend(&send_buffer[prev_ctr], ctr - prev_ctr, MPI_PACKED, proc, tag,
                mpi_comm, &send_requests[i]);
        prev_ctr = ctr;
    }

    if (send_buffer) *send_buffer_ptr = send_buffer;
}